

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.h
# Opt level: O0

S2Point * __thiscall S2Polyline::vertex(S2Polyline *this,int k)

{
  ostream *poVar1;
  type pVVar2;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  S2Polyline *pSStack_10;
  int k_local;
  S2Polyline *this_local;
  
  local_29 = 0;
  local_14 = k;
  pSStack_10 = this;
  if (k < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.h"
               ,0x72,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar1 = S2LogMessage::stream(&local_28);
    poVar1 = std::operator<<(poVar1,"Check failed: (k) >= (0) ");
    S2LogMessageVoidify::operator&(&local_15,poVar1);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  if (this->num_vertices_ <= local_14) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.h"
               ,0x73,kFatal,(ostream *)&std::cerr);
    poVar1 = S2LogMessage::stream(&local_50);
    poVar1 = std::operator<<(poVar1,"Check failed: (k) < (num_vertices_) ");
    S2LogMessageVoidify::operator&(local_3d,poVar1);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  pVVar2 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                     (&this->vertices_,(long)local_14);
  return pVVar2;
}

Assistant:

const S2Point& vertex(int k) const {
    S2_DCHECK_GE(k, 0);
    S2_DCHECK_LT(k, num_vertices_);
    return vertices_[k];
  }